

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O3

void cf_hash_drbg_sha256_gen_additional
               (cf_hash_drbg_sha256 *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  code *pcVar1;
  int oi;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  ulong nin;
  uint8_t *bout;
  ulong __n;
  size_t sVar5;
  bool bVar6;
  uint8_t three;
  uint8_t two;
  uint8_t w [64];
  cf_chash_ctx ctx_1;
  undefined1 local_251;
  void *local_250;
  code *local_248;
  code *local_240;
  code *local_238;
  uint local_22c;
  size_t local_228;
  ulong local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined7 uStack_1f0;
  undefined1 uStack_1e9;
  undefined7 uStack_1e8;
  uint8_t local_1d8 [64];
  undefined1 local_198 [360];
  
  if (nout != 0) {
    local_238 = cf_sha256_init;
    local_240 = cf_sha256_update;
    local_248 = cf_sha256_digest;
    uVar2 = ctx->reseed_counter;
    do {
      sVar5 = 0x10000;
      if (nout < 0x10000) {
        sVar5 = nout;
      }
      local_228 = sVar5;
      if (uVar2 == 0) {
        abort();
      }
      local_220 = nout;
      if (naddnl != 0) {
        local_218 = CONCAT71(local_218._1_7_,2);
        local_250 = addnl;
        (*local_238)(local_198);
        pcVar1 = local_240;
        (*local_240)(local_198,&local_218,1);
        (*pcVar1)(local_198,ctx,0x37);
        (*pcVar1)(local_198,local_250,naddnl);
        (*local_248)(local_198,local_1d8);
        add(ctx->V,(size_t)local_1d8,(uint8_t *)0x20,sVar5);
      }
      uStack_1e8 = (undefined7)((ulong)*(undefined8 *)(ctx->V + 0x2f) >> 8);
      local_218 = *(undefined8 *)ctx->V;
      uStack_210 = *(undefined8 *)(ctx->V + 8);
      local_208 = *(undefined8 *)(ctx->V + 0x10);
      uStack_200 = *(undefined8 *)(ctx->V + 0x18);
      local_1f8 = *(undefined8 *)(ctx->V + 0x20);
      uStack_1f0 = (undefined7)*(undefined8 *)(ctx->V + 0x28);
      uStack_1e9 = (undefined1)((ulong)*(undefined8 *)(ctx->V + 0x28) >> 0x38);
      sVar5 = local_228;
      local_250 = out;
      do {
        (*local_238)(local_198);
        (*local_240)(local_198,&local_218,0x37);
        (*local_248)(local_198,local_1d8);
        __n = sVar5;
        if (0x20 < sVar5) {
          __n = 0x20;
        }
        memcpy(out,local_1d8,__n);
        lVar3 = 0x36;
        nin = 0;
        do {
          uVar4 = (int)nin + (uint)(0 < (int)lVar3 + -0x35) +
                  (uint)*(byte *)((long)&local_218 + lVar3);
          *(char *)((long)&local_218 + lVar3) = (char)uVar4;
          nin = (ulong)(uVar4 >> 8);
          bVar6 = lVar3 != 0;
          lVar3 = lVar3 + -1;
        } while (bVar6);
        out = (void *)((long)out + __n);
        sVar5 = sVar5 - __n;
      } while (sVar5 != 0);
      local_251 = 3;
      (*local_238)(local_198);
      pcVar1 = local_240;
      (*local_240)(local_198,&local_251,1);
      (*pcVar1)(local_198,ctx,0x37);
      (*local_248)(local_198,local_1d8);
      uVar4 = ctx->reseed_counter;
      local_22c = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      add(ctx->V,(size_t)local_1d8,(uint8_t *)0x20,nin);
      lVar3 = 0x36;
      uVar4 = 0;
      do {
        uVar4 = (uint)ctx->C[lVar3] + uVar4 + ctx->V[lVar3];
        ctx->V[lVar3] = (uint8_t)uVar4;
        uVar4 = uVar4 >> 8;
        bVar6 = lVar3 != 0;
        lVar3 = lVar3 + -1;
      } while (bVar6);
      lVar3 = 0x36;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + ctx->V[lVar3];
        if (0 < (int)lVar3 + -0x32) {
          uVar4 = uVar4 + *(byte *)((long)&local_22c + (lVar3 - 0x33U & 0xffffffff));
        }
        ctx->V[lVar3] = (uint8_t)uVar4;
        uVar4 = uVar4 >> 8;
        bVar6 = lVar3 != 0;
        lVar3 = lVar3 + -1;
      } while (bVar6);
      uVar2 = ctx->reseed_counter + 1;
      ctx->reseed_counter = uVar2;
      out = (void *)((long)local_250 + local_228);
      addnl = (void *)0x0;
      naddnl = 0;
      nout = local_220 - local_228;
    } while (nout != 0);
  }
  return;
}

Assistant:

void cf_hash_drbg_sha256_gen_additional(cf_hash_drbg_sha256 *ctx,
                                        const void *addnl, size_t naddnl,
                                        void *out, size_t nout)
{
  uint8_t *bout = out;

  /* Generate output in requests of MAX_DRBG_GENERATE in size. */
  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hash_gen_request(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}